

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

void __thiscall node::BlockManager::CleanupBlockRevFiles(BlockManager *this)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  int iVar4;
  path *ppVar5;
  path *ppVar6;
  _Base_ptr p_Var7;
  int iVar8;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view str;
  string_view source_file;
  directory_iterator it;
  path local_138;
  path local_108;
  path local_e0;
  path local_b8;
  string path;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  mapBlockFiles;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header;
  mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  logging_function._M_str = "CleanupBlockRevFiles";
  logging_function._M_len = 0x14;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
  ;
  source_file._M_len = 0x65;
  mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  LogPrintFormatInternal<>
            (logging_function,source_file,0x27c,ALL,Info,(ConstevalFormatString<0U>)0x68d1ce);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&it,&(this->m_opts).blocks_dir.super_path);
  while( true ) {
    _Var2._M_pi = it._M_dir._M_refcount._M_pi;
    local_b8._M_pathname._M_dataplus._M_p = (pointer)0x0;
    local_b8._M_pathname._M_string_length = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8._M_pathname._M_string_length)
    ;
    if (_Var2._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) break;
    ppVar5 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&it);
    std::filesystem::__cxx11::path::filename(&local_e0,ppVar5);
    std::filesystem::__cxx11::path::path(&local_b8,&local_e0);
    std::filesystem::__cxx11::path::string(&path,&local_b8);
    std::filesystem::__cxx11::path::~path(&local_b8);
    std::filesystem::__cxx11::path::~path(&local_e0);
    ppVar5 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&it);
    bVar3 = std::filesystem::is_regular_file(ppVar5);
    if (bVar3 && path._M_string_length == 0xc) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_b8._M_pathname,&path,8,4);
      bVar3 = std::operator==(&local_b8._M_pathname,".dat");
      std::__cxx11::string::~string((string *)&local_b8);
      if (bVar3) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_b8._M_pathname,&path,0,3);
        bVar3 = std::operator==(&local_b8._M_pathname,"blk");
        std::__cxx11::string::~string((string *)&local_b8);
        if (bVar3) {
          ppVar5 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&it);
          std::filesystem::__cxx11::path::path(&local_108,ppVar5);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_b8._M_pathname,&path,3,5);
          ppVar5 = &std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
                    ::operator[](&mapBlockFiles,&local_b8._M_pathname)->super_path;
          std::filesystem::__cxx11::path::operator=(ppVar5,&local_108);
          std::__cxx11::string::~string((string *)&local_b8);
          std::filesystem::__cxx11::path::~path(&local_108);
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_b8._M_pathname,&path,0,3);
          bVar3 = std::operator==(&local_b8._M_pathname,"rev");
          std::__cxx11::string::~string((string *)&local_b8);
          if (bVar3) {
            ppVar6 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&it);
            std::filesystem::remove(ppVar6);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&path);
    std::filesystem::__cxx11::directory_iterator::operator++
              ((__directory_iterator_proxy *)&local_138,&it,0);
    std::filesystem::__cxx11::path::~path(&local_138);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&it._M_dir._M_refcount);
  iVar8 = 0;
  for (p_Var7 = mapBlockFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &mapBlockFiles._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7)) {
    str._M_str = *(char **)(p_Var7 + 1);
    str._M_len = (size_t)p_Var7[1]._M_parent;
    iVar4 = LocaleIndependentAtoi<int>(str);
    if (iVar4 == iVar8) {
      iVar8 = iVar8 + 1;
    }
    else {
      std::filesystem::remove((path *)(p_Var7 + 2));
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  ::~_Rb_tree(&mapBlockFiles._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BlockManager::CleanupBlockRevFiles() const
{
    std::map<std::string, fs::path> mapBlockFiles;

    // Glob all blk?????.dat and rev?????.dat files from the blocks directory.
    // Remove the rev files immediately and insert the blk file paths into an
    // ordered map keyed by block file index.
    LogPrintf("Removing unusable blk?????.dat and rev?????.dat files for -reindex with -prune\n");
    for (fs::directory_iterator it(m_opts.blocks_dir); it != fs::directory_iterator(); it++) {
        const std::string path = fs::PathToString(it->path().filename());
        if (fs::is_regular_file(*it) &&
            path.length() == 12 &&
            path.substr(8,4) == ".dat")
        {
            if (path.substr(0, 3) == "blk") {
                mapBlockFiles[path.substr(3, 5)] = it->path();
            } else if (path.substr(0, 3) == "rev") {
                remove(it->path());
            }
        }
    }

    // Remove all block files that aren't part of a contiguous set starting at
    // zero by walking the ordered map (keys are block file indices) by
    // keeping a separate counter.  Once we hit a gap (or if 0 doesn't exist)
    // start removing block files.
    int nContigCounter = 0;
    for (const std::pair<const std::string, fs::path>& item : mapBlockFiles) {
        if (LocaleIndependentAtoi<int>(item.first) == nContigCounter) {
            nContigCounter++;
            continue;
        }
        remove(item.second);
    }
}